

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QTimeZonePrivate::Data>::reallocateAndGrow
          (QArrayDataPointer<QTimeZonePrivate::Data> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTimeZonePrivate::Data> *old)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  undefined1 *puVar5;
  bool bVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  Data *pDVar10;
  Data *pDVar11;
  long lVar12;
  long lVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<QTimeZonePrivate::Data> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QTimeZonePrivate::Data> *)0x0 && where == GrowsAtEnd) {
    pDVar4 = this->d;
    if (pDVar4 == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pDVar4 == (Data *)0x0) {
        lVar13 = 0;
        lVar12 = 0;
      }
      else {
        lVar13 = (pDVar4->super_QArrayData).alloc;
        lVar12 = (this->size - (pDVar4->super_QArrayData).alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4) * -0x5555555555555555;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::reallocate
                  ((QMovableArrayOps<QTimeZonePrivate::Data> *)this,lVar13 + n + lVar12,Grow);
        return;
      }
      goto LAB_0040615a;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (Data *)0x0)) {
    if (this->size != 0) {
      lVar13 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar6 = true;
      }
      else {
        bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pDVar10 = this->ptr;
      pDVar11 = pDVar10 + lVar13;
      if ((old != (QArrayDataPointer<QTimeZonePrivate::Data> *)0x0) || (bVar6)) {
        if ((lVar13 != 0) && (0 < lVar13)) {
          do {
            pDVar1 = (pDVar10->abbreviation).d.d;
            local_38.ptr[local_38.size].abbreviation.d.d = pDVar1;
            local_38.ptr[local_38.size].abbreviation.d.ptr = (pDVar10->abbreviation).d.ptr;
            local_38.ptr[local_38.size].abbreviation.d.size = (pDVar10->abbreviation).d.size;
            if (pDVar1 != (Data *)0x0) {
              LOCK();
              (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                   (__atomic_base<int>)
                   ((__int_type_conflict)
                    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
              UNLOCK();
            }
            local_38.ptr[local_38.size].daylightTimeOffset = pDVar10->daylightTimeOffset;
            iVar8 = pDVar10->offsetFromUtc;
            iVar9 = pDVar10->standardTimeOffset;
            local_38.ptr[local_38.size].atMSecsSinceEpoch = pDVar10->atMSecsSinceEpoch;
            local_38.ptr[local_38.size].offsetFromUtc = iVar8;
            local_38.ptr[local_38.size].standardTimeOffset = iVar9;
            pDVar10 = pDVar10 + 1;
            local_38.size = local_38.size + 1;
          } while (pDVar10 < pDVar11);
        }
      }
      else if ((lVar13 != 0) && (0 < lVar13)) {
        do {
          pDVar1 = (pDVar10->abbreviation).d.d;
          (pDVar10->abbreviation).d.d = (Data *)0x0;
          local_38.ptr[local_38.size].abbreviation.d.d = pDVar1;
          pcVar2 = (pDVar10->abbreviation).d.ptr;
          (pDVar10->abbreviation).d.ptr = (char16_t *)0x0;
          local_38.ptr[local_38.size].abbreviation.d.ptr = pcVar2;
          qVar3 = (pDVar10->abbreviation).d.size;
          (pDVar10->abbreviation).d.size = 0;
          local_38.ptr[local_38.size].abbreviation.d.size = qVar3;
          uVar7 = *(undefined8 *)&pDVar10->offsetFromUtc;
          local_38.ptr[local_38.size].atMSecsSinceEpoch = pDVar10->atMSecsSinceEpoch;
          (&local_38.ptr[local_38.size].atMSecsSinceEpoch)[1] = uVar7;
          local_38.ptr[local_38.size].daylightTimeOffset = pDVar10->daylightTimeOffset;
          pDVar10 = pDVar10 + 1;
          local_38.size = local_38.size + 1;
        } while (pDVar10 < pDVar11);
      }
    }
    pDVar4 = this->d;
    pDVar10 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar5 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = pDVar4;
    local_38.ptr = pDVar10;
    local_38.size = (qsizetype)puVar5;
    if (old != (QArrayDataPointer<QTimeZonePrivate::Data> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar4;
      old->ptr = pDVar10;
      local_38.size = old->size;
      old->size = (qsizetype)puVar5;
    }
    ~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_0040615a:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }